

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadbase.c
# Opt level: O2

void checkAfkDist(afk_meta_t *d,int x,int z)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  int x_00;
  
  while( true ) {
    if ((((z | x) < 0) || (d->w <= x)) || (d->h <= z)) {
      return;
    }
    piVar1 = d->buf;
    uVar4 = d->w * z + x;
    if (piVar1[uVar4] != 0) {
      return;
    }
    iVar2 = blocksInRange(d->p,d->n,d->x0 + x,d->z0 + z,d->ax,d->az,d->rsq);
    piVar1[(int)uVar4] = iVar2;
    if (iVar2 < d->best) break;
    if (d->best < iVar2) {
      d->best = iVar2;
      d->sumn = 1;
      d->sumx = (long)(d->x0 + x);
      lVar3 = (long)(d->z0 + z);
    }
    else {
      d->sumn = d->sumn + 1;
      d->sumx = d->sumx + (long)(d->x0 + x);
      lVar3 = (long)(d->z0 + z) + d->sumz;
    }
    d->sumz = lVar3;
    iVar2 = z - 1;
    checkAfkDist(d,x,iVar2);
    uVar4 = z + 1;
    checkAfkDist(d,x,uVar4);
    x_00 = x - 1;
    checkAfkDist(d,x_00,z);
    x = x + 1;
    checkAfkDist(d,x,z);
    checkAfkDist(d,x_00,iVar2);
    checkAfkDist(d,x_00,uVar4);
    checkAfkDist(d,x,iVar2);
    z = uVar4;
  }
  return;
}

Assistant:

static void checkAfkDist(afk_meta_t *d, int x, int z)
{
    if (x < 0 || z < 0 || x >= d->w || z >= d->h)
        return;
    if (d->buf[z*d->w+x])
        return;

    int q = blocksInRange(d->p, d->n, x+d->x0, z+d->z0, d->ax, d->az, d->rsq);
    d->buf[z*d->w+x] = q;
    if (q >= d->best)
    {
        if (q > d->best)
        {
            d->best = q;
            d->sumn = 1;
            d->sumx = d->x0+x;
            d->sumz = d->z0+z;
        }
        else
        {
            d->sumn += 1;
            d->sumx += d->x0+x;
            d->sumz += d->z0+z;
        }
        checkAfkDist(d, x, z-1);
        checkAfkDist(d, x, z+1);
        checkAfkDist(d, x-1, z);
        checkAfkDist(d, x+1, z);
        checkAfkDist(d, x-1, z-1);
        checkAfkDist(d, x-1, z+1);
        checkAfkDist(d, x+1, z-1);
        checkAfkDist(d, x+1, z+1);
    }
}